

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

char * google::protobuf::io::anon_unknown_0::FloatToBuffer(float value,char *buffer)

{
  Nonnull<char_*> pcVar1;
  bool bVar2;
  uint uVar3;
  LogMessage *pLVar4;
  double dVar5;
  double dVar6;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  LogMessageFatal local_c0 [19];
  Voidify local_ad;
  int local_ac;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)654848>
  local_a8;
  float local_98;
  byte local_91;
  float parsed_value;
  char *local_88;
  LogMessageFatal local_80 [19];
  Voidify local_6d;
  int local_6c;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)654848>
  local_68;
  int local_54;
  undefined1 local_50 [4];
  int snprintf_result;
  FormatSpecTemplate<> local_40;
  FormatSpecTemplate<> local_30;
  Nonnull<char_*> local_20;
  char *buffer_local;
  char *pcStack_10;
  float value_local;
  
  local_20 = buffer;
  buffer_local._4_4_ = value;
  dVar5 = std::numeric_limits<double>::infinity();
  pcVar1 = local_20;
  if (((double)value != dVar5) || (NAN((double)value) || NAN(dVar5))) {
    dVar5 = (double)buffer_local._4_4_;
    dVar6 = std::numeric_limits<double>::infinity();
    pcVar1 = local_20;
    if ((dVar5 != -dVar6) || (NAN(dVar5) || NAN(-dVar6))) {
      uVar3 = std::isnan((double)(ulong)(uint)buffer_local._4_4_);
      pcVar1 = local_20;
      if ((uVar3 & 1) == 0) {
        absl::lts_20240722::str_format_internal::
        FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)654848>
        ::FormatSpecTemplate(&local_68,"%.*g");
        local_6c = 6;
        local_54 = absl::lts_20240722::SNPrintF<int,_float>
                             (pcVar1,0x18,&local_68,&local_6c,(float *)((long)&buffer_local + 4));
        local_91 = 0;
        if (local_54 < 1 || 0x17 < local_54) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&parsed_value,
                     "snprintf_result > 0 && snprintf_result < kFloatToBufferSize");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/strtod.cc"
                     ,0xbc,_parsed_value,local_88);
          local_91 = 1;
          pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_80);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_6d,pLVar4);
        }
        if ((local_91 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_80);
        }
        bVar2 = safe_strtof(local_20,&local_98);
        pcVar1 = local_20;
        if (((!bVar2) || (local_98 != buffer_local._4_4_)) ||
           (NAN(local_98) || NAN(buffer_local._4_4_))) {
          absl::lts_20240722::str_format_internal::
          FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)654848>
          ::FormatSpecTemplate(&local_a8,"%.*g");
          local_ac = 9;
          local_54 = absl::lts_20240722::SNPrintF<int,_float>
                               (pcVar1,0x18,&local_a8,&local_ac,(float *)((long)&buffer_local + 4));
          if (local_54 < 1 || 0x17 < local_54) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_d0,"snprintf_result > 0 && snprintf_result < kFloatToBufferSize");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/strtod.cc"
                       ,0xc4,local_d0._M_len,local_d0._M_str);
            pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                               ((LogMessage *)local_c0);
            absl::lts_20240722::log_internal::Voidify::operator&&(&local_ad,pLVar4);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_c0);
          }
        }
        DelocalizeRadix(local_20);
        pcStack_10 = local_20;
      }
      else {
        absl::lts_20240722::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
                  ((FormatSpecTemplate<> *)local_50,"nan");
        absl::lts_20240722::SNPrintF<>(pcVar1,0x18,(FormatSpec<> *)local_50);
        pcStack_10 = local_20;
      }
    }
    else {
      absl::lts_20240722::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
                (&local_40,"-inf");
      absl::lts_20240722::SNPrintF<>(pcVar1,0x18,&local_40);
      pcStack_10 = local_20;
    }
  }
  else {
    absl::lts_20240722::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
              (&local_30,"inf");
    absl::lts_20240722::SNPrintF<>(pcVar1,0x18,&local_30);
    pcStack_10 = local_20;
  }
  return pcStack_10;
}

Assistant:

char *FloatToBuffer(float value, char *buffer) {
  // FLT_DIG is 6 for IEEE-754 floats, which are used on almost all
  // platforms these days.  Just in case some system exists where FLT_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  static_assert(FLT_DIG < 10, "FLT_DIG_is_too_big");

  if (value == std::numeric_limits<double>::infinity()) {
    absl::SNPrintF(buffer, kFloatToBufferSize, "inf");
    return buffer;
  } else if (value == -std::numeric_limits<double>::infinity()) {
    absl::SNPrintF(buffer, kFloatToBufferSize, "-inf");
    return buffer;
  } else if (std::isnan(value)) {
    absl::SNPrintF(buffer, kFloatToBufferSize, "nan");
    return buffer;
  }

  int snprintf_result =
      absl::SNPrintF(buffer, kFloatToBufferSize, "%.*g", FLT_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  ABSL_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);

  float parsed_value;
  if (!safe_strtof(buffer, &parsed_value) || parsed_value != value) {
    snprintf_result =
        absl::SNPrintF(buffer, kFloatToBufferSize, "%.*g", FLT_DIG + 3, value);

    // Should never overflow; see above.
    ABSL_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);
  }

  DelocalizeRadix(buffer);
  return buffer;
}